

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  bool bVar1;
  CacheEntryType CVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  PolicyID id;
  ulong uVar5;
  cmAlphaNum *this_00;
  long lVar6;
  string_view arg;
  string_view value_00;
  string nvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_a0 [32];
  cmAlphaNum local_80;
  string local_50;
  
  cVar4 = cmState::GetInitializedCacheValue
                    ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
  nvalue._M_dataplus._M_p = (pointer)&nvalue.field_2;
  nvalue._M_string_length = 0;
  nvalue.field_2._M_local_buf[0] = '\0';
  if ((cVar4.Value != (string *)0x0) &&
     (CVar2 = cmState::GetCacheEntryType
                        ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name),
     CVar2 == UNINITIALIZED)) {
    if (!force) {
      value = ((cVar4.Value)->_M_dataplus)._M_p;
    }
    if (type - PATH < 2) {
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::assign((char *)&nvalue);
      arg._M_str = nvalue._M_dataplus._M_p;
      arg._M_len = nvalue._M_string_length;
      cmExpandList(arg,&files,false);
      nvalue._M_string_length = 0;
      *nvalue._M_dataplus._M_p = '\0';
      lVar6 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1)
      {
        value_00._M_str =
             *(char **)((long)&((files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6);
        value_00._M_len =
             *(size_t *)
              ((long)&(files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar6);
        bVar1 = cmValue::IsOff(value_00);
        if (!bVar1) {
          cmsys::SystemTools::CollapseFullPath
                    ((string *)&local_80,
                     (string *)
                     ((long)&((files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6
                     ));
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6
                     ),(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
        }
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)&nvalue);
        }
        std::__cxx11::string::append((string *)&nvalue);
        lVar6 = lVar6 + 0x20;
      }
      cmake::AddCacheEntry(this->GlobalGenerator->CMakeInstance,name,&nvalue,doc,type);
      cmState::GetInitializedCacheValue
                ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
      std::__cxx11::string::_M_assign((string *)&nvalue);
      value = (char *)nvalue._M_dataplus;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
    }
  }
  cmake::AddCacheEntry(this->GlobalGenerator->CMakeInstance,name,value,doc,type);
  PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0126,false);
  if (PVar3 != OLD) {
    if (PVar3 != WARN) goto LAB_001899ac;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_POLICY_WARNING_CMP0126",(allocator<char> *)&files);
    bVar1 = PolicyOptionalWarningEnabled(this,(string *)&local_80);
    if (bVar1) {
      bVar1 = IsNormalDefinitionSet(this,name);
      std::__cxx11::string::~string((string *)&local_80);
      if (!bVar1) goto LAB_001899a1;
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_a0,(cmPolicies *)0x7e,id);
      local_80.View_._M_len = local_a0._8_8_;
      local_80.View_._M_str = (char *)local_a0._0_8_;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000042;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_17f6f7;
      cmStrCat<std::__cxx11::string,char[42]>
                (&local_50,&local_80,(cmAlphaNum *)&files,name,
                 (char (*) [42])"\" will be removed from the current scope.");
      IssueMessage(this,AUTHOR_WARNING,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (cmAlphaNum *)local_a0;
    }
    else {
      this_00 = &local_80;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
LAB_001899a1:
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
LAB_001899ac:
  std::__cxx11::string::~string((string *)&nvalue);
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmStateEnums::CacheEntryType type,
                                    bool force)
{
  cmValue existingValue = this->GetState()->GetInitializedCacheValue(name);
  // must be outside the following if() to keep it alive long enough
  std::string nvalue;

  if (existingValue &&
      (this->GetState()->GetCacheEntryType(name) ==
       cmStateEnums::UNINITIALIZED)) {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if (!force) {
      value = existingValue->c_str();
    }
    if (type == cmStateEnums::PATH || type == cmStateEnums::FILEPATH) {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      nvalue = value ? value : "";

      cmExpandList(nvalue, files);
      nvalue.clear();
      for (cc = 0; cc < files.size(); cc++) {
        if (!cmIsOff(files[cc])) {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
        }
        if (cc > 0) {
          nvalue += ";";
        }
        nvalue += files[cc];
      }

      this->GetCMakeInstance()->AddCacheEntry(name, nvalue, doc, type);
      nvalue = *this->GetState()->GetInitializedCacheValue(name);
      value = nvalue.c_str();
    }
  }
  this->GetCMakeInstance()->AddCacheEntry(name, value, doc, type);
  switch (this->GetPolicyStatus(cmPolicies::CMP0126)) {
    case cmPolicies::WARN:
      if (this->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0126") &&
          this->IsNormalDefinitionSet(name)) {
        this->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0126),
                   "\nFor compatibility with older versions of CMake, normal "
                   "variable \"",
                   name, "\" will be removed from the current scope."));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // if there was a definition then remove it
      this->StateSnapshot.RemoveDefinition(name);
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      break;
  }
}